

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O2

void __thiscall Assimp::XFile::Scene::~Scene(Scene *this)

{
  Node *this_00;
  pointer ppMVar1;
  Mesh *this_01;
  pointer ppAVar2;
  Animation *this_02;
  uint uVar3;
  
  this_00 = this->mRootNode;
  if (this_00 != (Node *)0x0) {
    XFile::Node::~Node(this_00);
  }
  operator_delete(this_00);
  this->mRootNode = (Node *)0x0;
  uVar3 = 0;
  while( true ) {
    ppMVar1 = (this->mGlobalMeshes).
              super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mGlobalMeshes).
                      super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3) <=
        (ulong)uVar3) break;
    this_01 = ppMVar1[uVar3];
    if (this_01 != (Mesh *)0x0) {
      XFile::Mesh::~Mesh(this_01);
    }
    operator_delete(this_01);
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    ppAVar2 = (this->mAnims).
              super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mAnims).
                      super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3) <=
        (ulong)uVar3) break;
    this_02 = ppAVar2[uVar3];
    if (this_02 != (Animation *)0x0) {
      Animation::~Animation(this_02);
    }
    operator_delete(this_02);
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::
  ~_Vector_base(&(this->mAnims).
                 super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
               );
  std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::~vector
            (&this->mGlobalMaterials);
  std::_Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::~_Vector_base
            (&(this->mGlobalMeshes).
              super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>);
  return;
}

Assistant:

~Scene() {
        delete mRootNode;
        mRootNode = nullptr;
        for (unsigned int a = 0; a < mGlobalMeshes.size(); ++a ) {
            delete mGlobalMeshes[a];
        }
        for (unsigned int a = 0; a < mAnims.size(); ++a ) {
            delete mAnims[a];
        }
    }